

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

S2Point * __thiscall
S2Builder::GetSeparationSite
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *site_to_avoid,S2Point *v0,
          S2Point *v1,InputEdgeId input_edge_id)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference b;
  BasicVector<Vector3,_double,_3UL> *this_00;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_148;
  S2LogMessageVoidify local_135 [20];
  byte local_121;
  S2LogMessage local_120;
  S2LogMessageVoidify local_109;
  S2Point local_108;
  D local_f0;
  D local_d8;
  D local_c0;
  undefined1 local_a8 [8];
  S2Point gap_max;
  S2Point gap_min;
  S2Point n;
  Vector3_d xy_dir;
  S2Point *y;
  S2Point *x;
  InputEdge *edge;
  InputEdgeId input_edge_id_local;
  S2Point *v1_local;
  S2Point *v0_local;
  S2Point *site_to_avoid_local;
  S2Builder *this_local;
  
  pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->input_edges_,(long)input_edge_id);
  b = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                (&this->input_vertices_,(long)pvVar2->first);
  this_00 = (BasicVector<Vector3,_double,_3UL> *)
            std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                      (&this->input_vertices_,(long)pvVar2->second);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(n.c_ + 2),this_00,b);
  S2::RobustCrossProd((Vector3_d *)(gap_min.c_ + 2),b,(S2Point *)this_00);
  S2::Project(__return_storage_ptr__,site_to_avoid,b,(S2Point *)this_00,
              (Vector3_d *)(gap_min.c_ + 2));
  GetCoverageEndpoint((S2Point *)(gap_max.c_ + 2),this,v0,b,(S2Point *)this_00,
                      (S2Point *)(gap_min.c_ + 2));
  util::math::internal_vector::operator-(&local_c0,(D *)(gap_min.c_ + 2));
  GetCoverageEndpoint((S2Point *)local_a8,this,v1,(S2Point *)this_00,b,&local_c0);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_d8,(BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,
             (D *)(gap_max.c_ + 2));
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)&local_d8,(D *)(n.c_ + 2));
  if (0.0 <= dVar4) {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_f0,(BasicVector<Vector3,_double,_3UL> *)local_a8,__return_storage_ptr__);
    dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_f0,(D *)(n.c_ + 2));
    if (dVar4 < 0.0) {
      __return_storage_ptr__->c_[0] = (VType)local_a8;
      __return_storage_ptr__->c_[1] = gap_max.c_[0];
      __return_storage_ptr__->c_[2] = gap_max.c_[1];
    }
  }
  else {
    __return_storage_ptr__->c_[0] = gap_max.c_[2];
    __return_storage_ptr__->c_[1] = gap_min.c_[0];
    __return_storage_ptr__->c_[2] = gap_min.c_[1];
  }
  SnapSite(&local_108,this,__return_storage_ptr__);
  __return_storage_ptr__->c_[0] = local_108.c_[0];
  __return_storage_ptr__->c_[1] = local_108.c_[1];
  __return_storage_ptr__->c_[2] = local_108.c_[2];
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)v0,__return_storage_ptr__);
  local_121 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x392,kFatal,(ostream *)&std::cerr);
    local_121 = 1;
    poVar3 = S2LogMessage::stream(&local_120);
    poVar3 = std::operator<<(poVar3,"Check failed: (v0) != (new_site) ");
    S2LogMessageVoidify::operator&(&local_109,poVar3);
  }
  if ((local_121 & 1) == 0) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)v1,__return_storage_ptr__);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_148,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x393,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_148);
      poVar3 = std::operator<<(poVar3,"Check failed: (v1) != (new_site) ");
      S2LogMessageVoidify::operator&(local_135,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_148);
    }
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_120);
}

Assistant:

S2Point S2Builder::GetSeparationSite(const S2Point& site_to_avoid,
                                     const S2Point& v0, const S2Point& v1,
                                     InputEdgeId input_edge_id) const {
  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius "snap_radius".  Similarly, define the "coverage interval" of S for
  // an edge XY to be the intersection of XY with the coverage disc of S.  The
  // SnapFunction implementations guarantee that the only way that a snapped
  // edge can be closer than min_edge_vertex_separation() to a non-snapped
  // site (i.e., site_to_avoid) if is there is a gap in the coverage of XY
  // near this site.  We can fix this problem simply by adding a new site to
  // fill this gap, located as closely as possible to the site to avoid.
  //
  // To calculate the coverage gap, we look at the two snapped sites on
  // either side of site_to_avoid, and find the endpoints of their coverage
  // intervals.  The we place a new site in the gap, located as closely as
  // possible to the site to avoid.  Note that the new site may move when it
  // is snapped by the snap_function, but it is guaranteed not to move by
  // more than snap_radius and therefore its coverage interval will still
  // intersect the gap.
  const InputEdge& edge = input_edges_[input_edge_id];
  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];
  Vector3_d xy_dir = y - x;
  S2Point n = S2::RobustCrossProd(x, y);
  S2Point new_site = S2::Project(site_to_avoid, x, y, n);
  S2Point gap_min = GetCoverageEndpoint(v0, x, y, n);
  S2Point gap_max = GetCoverageEndpoint(v1, y, x, -n);
  if ((new_site - gap_min).DotProd(xy_dir) < 0) {
    new_site = gap_min;
  } else if ((gap_max - new_site).DotProd(xy_dir) < 0) {
    new_site = gap_max;
  }
  new_site = SnapSite(new_site);
  S2_DCHECK_NE(v0, new_site);
  S2_DCHECK_NE(v1, new_site);
  return new_site;
}